

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O0

pair<long,_long> pstore::utf::slice(czstring str,ptrdiff_t start,ptrdiff_t end)

{
  czstring last_00;
  char *pcVar1;
  size_t sVar2;
  size_t *psVar3;
  long local_b8;
  long local_b0;
  long local_80;
  long local_78 [2];
  char *local_68;
  czstring p2;
  char *local_58;
  czstring p1;
  char *last;
  char *first;
  pair<int,_int> local_38;
  ptrdiff_t local_30;
  ptrdiff_t end_local;
  ptrdiff_t start_local;
  czstring str_local;
  
  local_30 = end;
  end_local = start;
  start_local = (ptrdiff_t)str;
  if (str == (czstring)0x0) {
    first._4_4_ = 0xffffffff;
    first._0_4_ = 0xffffffff;
    local_38 = std::make_pair<int,int>((int *)((long)&first + 4),(int *)&first);
    std::pair<long,_long>::pair<int,_int,_true>((pair<long,_long> *)&str_local,&local_38);
  }
  else {
    last = str;
    sVar2 = strlen(str);
    pcVar1 = last;
    p2 = (czstring)0x0;
    p1 = str + sVar2;
    psVar3 = (size_t *)std::max<long>((long *)&p2,&end_local);
    local_58 = index<char_const*>(pcVar1,str + sVar2,*psVar3);
    pcVar1 = last;
    last_00 = p1;
    local_78[1] = 0;
    psVar3 = (size_t *)std::max<long>(local_78 + 1,&local_30);
    local_68 = index<char_const*>(pcVar1,last_00,*psVar3);
    if (local_58 == p1) {
      local_b0 = -1;
    }
    else {
      local_b0 = (long)local_58 - start_local;
    }
    local_78[0] = local_b0;
    if (local_68 == p1) {
      local_b8 = -1;
    }
    else {
      local_b8 = (long)local_68 - start_local;
    }
    local_80 = local_b8;
    _str_local = std::make_pair<long,long>(local_78,&local_80);
  }
  return _str_local;
}

Assistant:

auto slice (gsl::czstring const str, std::ptrdiff_t const start, std::ptrdiff_t const end)
            -> std::pair<std::ptrdiff_t, std::ptrdiff_t> {

            if (str == nullptr) {
                return std::make_pair (-1, -1);
            }

            auto const * const first = str;
            auto const * const last = str + strlen (str);
            gsl::czstring p1 =
                index (first, last, static_cast<std::size_t> (std::max (std::ptrdiff_t{0}, start)));
            gsl::czstring p2 =
                index (first, last, static_cast<std::size_t> (std::max (std::ptrdiff_t{0}, end)));
            return std::make_pair ((p1 != last) ? p1 - str : -1, (p2 != last) ? p2 - str : -1);
        }